

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall CaDiCaL::Solver::limit(Solver *this,char *arg,int val)

{
  FILE *__stream;
  undefined8 in_RCX;
  char *file_name;
  char *name;
  bool bVar1;
  
  bVar1 = this->internal == (Internal *)0x0;
  __stream = (FILE *)this->trace_api_file;
  file_name = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),__stream == (FILE *)0x0 || bVar1);
  if (__stream != (FILE *)0x0 && !bVar1) {
    file_name = arg;
    fprintf(__stream,"%s %s %d\n","limit",arg,(ulong)(uint)val);
    fflush((FILE *)this->trace_api_file);
  }
  name = "bool CaDiCaL::Solver::limit(const char *, int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"bool CaDiCaL::Solver::limit(const char *, int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,file_name);
  if (this->external == (External *)0x0) {
    limit();
  }
  else if (this->internal != (Internal *)0x0) {
    if ((this->_state & VALID) != 0) {
      bVar1 = Internal::limit(this->internal,arg,val);
      return bVar1;
    }
    goto LAB_0085da23;
  }
  limit();
LAB_0085da23:
  limit();
  bVar1 = Internal::is_valid_limit(name);
  return bVar1;
}

Assistant:

bool Solver::limit (const char *arg, int val) {
  TRACE ("limit", arg, val);
  REQUIRE_VALID_STATE ();
  bool res = internal->limit (arg, val);
  LOG_API_CALL_END ("limit", arg, val, res);
  return res;
}